

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O1

QByteArray * __thiscall
QBufferPrivate::peek(QByteArray *__return_storage_ptr__,QBufferPrivate *this,qint64 maxSize)

{
  long lVar1;
  QByteArray *pQVar2;
  long lVar3;
  Data *pDVar4;
  long size;
  char *pcVar5;
  
  lVar1 = (this->super_QIODevicePrivate).pos;
  pQVar2 = this->buf;
  lVar3 = (pQVar2->d).size;
  if (maxSize < lVar3 || lVar1 != 0) {
    size = lVar3 - lVar1;
    if (maxSize <= lVar3 - lVar1) {
      size = maxSize;
    }
    pcVar5 = (pQVar2->d).ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    QByteArray::QByteArray(__return_storage_ptr__,pcVar5 + lVar1,size);
  }
  else {
    pDVar4 = (pQVar2->d).d;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = (pQVar2->d).ptr;
    (__return_storage_ptr__->d).size = lVar3;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QBufferPrivate::peek(qint64 maxSize)
{
    qint64 readBytes = qMin(maxSize, static_cast<qint64>(buf->size()) - pos);
    if (pos == 0 && maxSize >= buf->size())
        return *buf;
    return QByteArray(buf->constData() + pos, readBytes);
}